

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_dist.cpp
# Opt level: O0

Read<int> __thiscall Omega_h::Dist::exch<int>(Dist *this,Read<int> *data,Int width)

{
  char *file;
  element_type *sendbuf_dev;
  Int in_ECX;
  undefined4 in_register_00000014;
  Read<int> *this_00;
  void *extraout_RDX;
  Read<int> RVar1;
  Read<int> local_1f0;
  Read<int> local_1e0;
  Write<int> local_1d0;
  Read<int> local_1c0;
  Read<int> local_1b0;
  Read<int> local_1a0;
  Read<int> local_190;
  undefined1 local_180 [48];
  Read<int> local_150;
  Read<int> local_140;
  Read<int> local_130;
  Read<int> local_120;
  ScopedTimer local_109;
  __cxx11 local_108 [7];
  ScopedTimer exch_timer;
  allocator local_d1;
  string local_d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [35];
  ScopedTimer local_6d;
  Int local_6c;
  ScopedTimer omega_h_scoped_function_timer;
  Read<int> *pRStack_68;
  Int width_local;
  Read<int> *data_local;
  Dist *this_local;
  
  this_00 = (Read<int> *)CONCAT44(in_register_00000014,width);
  local_6c = in_ECX;
  pRStack_68 = this_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_dist.cpp"
             ,&local_d1);
  std::operator+(local_b0,(char *)local_d0);
  std::__cxx11::to_string(local_108,0x6e);
  std::operator+(local_90,local_b0);
  file = (char *)std::__cxx11::string::c_str();
  ScopedTimer::ScopedTimer(&local_6d,"exch",file);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  ScopedTimer::ScopedTimer(&local_109,"Dist::exch",(char *)0x0);
  if (data[1].write_.shared_alloc_.direct_ptr != (void *)0x0) {
    Read<int>::Read(&local_130,this_00);
    Read<int>::Read(&local_140,data + 1);
    expand<int>((Omega_h *)&local_120,&local_130,&local_140,local_6c);
    Read<int>::operator=(this_00,&local_120);
    Read<int>::~Read(&local_120);
    Read<int>::~Read(&local_140);
    Read<int>::~Read(&local_130);
  }
  if (data[3].write_.shared_alloc_.direct_ptr != (void *)0x0) {
    Read<int>::Read((Read<int> *)(local_180 + 0x20),this_00);
    Read<int>::Read((Read<int> *)(local_180 + 0x10),data + 3);
    permute<int>((Omega_h *)&local_150,(Read<int> *)(local_180 + 0x20),(LOs *)(local_180 + 0x10),
                 local_6c);
    Read<int>::operator=(this_00,&local_150);
    Read<int>::~Read(&local_150);
    Read<int>::~Read((Read<int> *)(local_180 + 0x10));
    Read<int>::~Read((Read<int> *)(local_180 + 0x20));
  }
  sendbuf_dev = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)(data + 7));
  Read<int>::Read(&local_190,this_00);
  Read<int>::Read(&local_1a0,data + 5);
  Read<int>::Read(&local_1b0,data + 6);
  Comm::alltoallv<int>
            ((Comm *)local_180,(Read<int> *)sendbuf_dev,&local_190,&local_1a0,(Int)&local_1b0);
  Read<int>::operator=(this_00,(Read<int> *)local_180);
  Read<int>::~Read((Read<int> *)local_180);
  Read<int>::~Read(&local_1b0);
  Read<int>::~Read(&local_1a0);
  Read<int>::~Read(&local_190);
  if (data[4].write_.shared_alloc_.direct_ptr != (void *)0x0) {
    Read<int>::Read(&local_1e0,data + 4);
    Read<int>::Read(&local_1f0,this_00);
    unmap<int>((Omega_h *)&local_1d0,&local_1e0,&local_1f0,local_6c);
    Read<int>::Read(&local_1c0,&local_1d0);
    Read<int>::operator=(this_00,&local_1c0);
    Read<int>::~Read(&local_1c0);
    Write<int>::~Write(&local_1d0);
    Read<int>::~Read(&local_1f0);
    Read<int>::~Read(&local_1e0);
  }
  Read<int>::Read((Read<int> *)this,this_00);
  ScopedTimer::~ScopedTimer(&local_109);
  ScopedTimer::~ScopedTimer(&local_6d);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<int>)RVar1.write_.shared_alloc_;
}

Assistant:

Read<T> Dist::exch(Read<T> data, Int width) const {
  OMEGA_H_TIME_FUNCTION;
  ScopedTimer exch_timer("Dist::exch");
  if (roots2items_[F].exists()) {
    data = expand(data, roots2items_[F], width);
  }
  if (items2content_[F].exists()) {
    data = permute(data, items2content_[F], width);
  }
  data = comm_[F]->alltoallv(data, msgs2content_[F], msgs2content_[R], width);
  if (items2content_[R].exists()) {
    data = unmap(items2content_[R], data, width);
  }
  return data;
}